

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O1

void __thiscall KokkosTools::SpaceTimeStack::State::end_kernel(State *this,uint64_t kernid)

{
  StackNode *pSVar1;
  long lVar2;
  ostream *poVar3;
  string local_30;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  pSVar1 = this->stack_frame;
  if (pSVar1 == (StackNode *)kernid) {
    pSVar1->total_runtime =
         (double)(lVar2 - (pSVar1->start_time).impl.__d.__r) * 1e-09 + pSVar1->total_runtime;
    this->stack_frame = pSVar1->parent;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected \"",10);
  StackNode::get_full_name_abi_cxx11_(&local_30,this->stack_frame);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::operator<<(poVar3,"\" to end, got different kernel ID\n");
  std::__cxx11::string::~string((string *)&local_30);
  abort();
}

Assistant:

void end_kernel(std::uint64_t kernid) {
    auto end_time    = now();
    auto expect_node = reinterpret_cast<StackNode*>(kernid);
    if (expect_node != stack_frame) {
      std::cerr << "Expected \"" << stack_frame->get_full_name()
                << "\" to end, got different kernel ID\n";
      abort();
    }
    end_frame(end_time);
  }